

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O3

void __thiscall JAMA::Eigenvalue<double>::hqr2(Eigenvalue<double> *this)

{
  double dVar1;
  double **ppdVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  double *pdVar14;
  int i;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  double **ppdVar18;
  double **ppdVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  double *pdVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  double dVar43;
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  double dVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar60;
  undefined4 uVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double local_c0;
  double local_b8;
  undefined1 local_a8 [16];
  double local_78;
  double dStack_40;
  
  uVar15 = this->n;
  lVar33 = (long)(int)uVar15;
  if (0 < lVar33) {
    uVar29 = uVar15 - 1;
    dVar76 = 0.0;
    lVar16 = 0;
    do {
      iVar27 = 1;
      if (1 < (int)lVar16) {
        iVar27 = (int)lVar16;
      }
      if (iVar27 <= (int)uVar15) {
        lVar26 = 0;
        do {
          dVar76 = dVar76 + ABS((this->H).data_[lVar16][(ulong)(iVar27 - 1) + lVar26]);
          lVar26 = lVar26 + 1;
        } while ((uVar15 + 1) - iVar27 != (int)lVar26);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar33);
    if (0 < (int)uVar15) {
      dVar43 = 0.0;
      dStack_40 = 0.0;
      local_c0 = 0.0;
      local_a8 = ZEXT816(0);
      iVar27 = 0;
      dVar62 = 0.0;
      dVar40 = 0.0;
      uVar31 = uVar29;
      do {
        uVar13 = (ulong)uVar31;
        if (uVar31 == 0) {
LAB_0011dfe5:
          pdVar14 = (this->H).data_[uVar13];
          dVar38 = pdVar14[uVar13] + local_c0;
          pdVar14[uVar13] = dVar38;
          (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = dVar38;
          (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = 0.0;
          uVar31 = uVar31 - 1;
LAB_0011e01d:
          iVar27 = 0;
        }
        else {
          ppdVar2 = (this->H).data_;
          pdVar14 = ppdVar2[uVar13];
          lVar16 = uVar13 + 1;
          dVar38 = pdVar14[uVar13];
          do {
            pdVar28 = pdVar14 + lVar16 + -2;
            pdVar14 = ppdVar2[lVar16 + -2];
            lVar26 = lVar16 + -2;
            dVar40 = ABS(dVar38) + ABS(pdVar14[lVar26]);
            uVar35 = -(ulong)(dVar40 == 0.0);
            dVar40 = (double)(uVar35 & (ulong)dVar76 | ~uVar35 & (ulong)dVar40);
            if (ABS(*pdVar28) < dVar40 * 2.220446049250313e-16) {
              uVar22 = (int)lVar16 - 1;
              goto LAB_0011dfe0;
            }
            lVar16 = lVar16 + -1;
            dVar38 = pdVar14[lVar26];
          } while (1 < lVar16);
          uVar22 = 0;
LAB_0011dfe0:
          if (uVar22 == uVar31) goto LAB_0011dfe5;
          uVar24 = uVar31 - 1;
          ppdVar2 = (this->H).data_;
          pdVar14 = ppdVar2[uVar13];
          if (uVar22 == uVar24) {
            dVar38 = pdVar14[uVar22];
            pdVar28 = ppdVar2[uVar22];
            dVar37 = pdVar28[uVar13];
            local_a8._0_8_ = (pdVar28[uVar22] - pdVar14[uVar13]) * 0.5;
            dStack_40 = (double)local_a8._0_8_ * (double)local_a8._0_8_ + dVar38 * dVar37;
            dVar43 = SQRT(ABS(dStack_40));
            pdVar14[uVar13] = pdVar14[uVar13] + local_c0;
            pdVar28[uVar22] = pdVar28[uVar22] + local_c0;
            dVar48 = pdVar14[uVar13];
            if (0.0 <= dStack_40) {
              local_a8._0_8_ =
                   (double)(~-(ulong)((double)local_a8._0_8_ < 0.0) & (ulong)dVar43 |
                           (ulong)-dVar43 & -(ulong)((double)local_a8._0_8_ < 0.0)) +
                   (double)local_a8._0_8_;
              pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[(int)uVar22] = (double)local_a8._0_8_ + dVar48;
              pdVar3[uVar13] =
                   (double)(-(ulong)((double)local_a8._0_8_ != 0.0) &
                            (ulong)(dVar48 - (dVar38 * dVar37) / (double)local_a8._0_8_) |
                           ~-(ulong)((double)local_a8._0_8_ != 0.0) &
                           (ulong)((double)local_a8._0_8_ + dVar48));
              pdVar3 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[(int)uVar22] = 0.0;
              pdVar3[uVar13] = 0.0;
              dVar40 = ABS((double)local_a8._0_8_) + ABS(pdVar14[uVar22]);
              dVar43 = pdVar14[uVar22] / dVar40;
              dStack_40 = (double)local_a8._0_8_ / dVar40;
              dVar62 = SQRT(dVar43 * dVar43 + dStack_40 * dStack_40);
              local_a8._0_8_ = dVar43 / dVar62;
              dStack_40 = dStack_40 / dVar62;
              if ((int)uVar31 <= (int)uVar15) {
                ppdVar2 = (this->H).data_;
                pdVar14 = ppdVar2[uVar22];
                pdVar28 = ppdVar2[uVar13];
                uVar24 = uVar22;
                do {
                  dVar43 = pdVar14[uVar24];
                  pdVar14[uVar24] = dStack_40 * dVar43 + pdVar28[uVar24] * (double)local_a8._0_8_;
                  pdVar28[uVar24] = pdVar28[uVar24] * dStack_40 + dVar43 * -(double)local_a8._0_8_;
                  uVar24 = uVar24 + 1;
                } while (uVar15 != uVar24);
              }
              if (-1 < (int)uVar31) {
                ppdVar2 = (this->H).data_;
                uVar35 = 0;
                do {
                  pdVar14 = ppdVar2[uVar35];
                  dVar43 = pdVar14[uVar22];
                  dVar38 = pdVar14[uVar13];
                  pdVar14[uVar22] = dStack_40 * dVar43 + (double)local_a8._0_8_ * dVar38;
                  pdVar14[uVar13] = dVar38 * dStack_40 + dVar43 * -(double)local_a8._0_8_;
                  uVar35 = uVar35 + 1;
                } while (uVar31 + 1 != uVar35);
              }
              ppdVar2 = (this->V).data_;
              lVar16 = 0;
              do {
                pdVar14 = ppdVar2[lVar16];
                dVar43 = pdVar14[uVar22];
                dVar38 = pdVar14[uVar13];
                pdVar14[uVar22] = dStack_40 * dVar43 + (double)local_a8._0_8_ * dVar38;
                pdVar14[uVar13] = dVar38 * dStack_40 + dVar43 * -(double)local_a8._0_8_;
                lVar16 = lVar16 + 1;
              } while (lVar33 != lVar16);
            }
            else {
              pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[(int)uVar22] = dVar48 + (double)local_a8._0_8_;
              pdVar3[uVar13] = dVar48 + (double)local_a8._0_8_;
              pdVar3 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[(int)uVar22] = dVar43;
              pdVar3[uVar13] = -dVar43;
            }
            local_a8._8_8_ = 0;
            uVar31 = uVar31 - 2;
            goto LAB_0011e01d;
          }
          local_b8 = 0.0;
          local_78 = 0.0;
          if ((int)uVar22 < (int)uVar31) {
            local_78 = ppdVar2[uVar24][uVar24];
            local_b8 = pdVar14[uVar24] * ppdVar2[uVar24][uVar13];
          }
          dVar38 = pdVar14[uVar13];
          if (iVar27 == 10) {
            if (-1 < (int)uVar31) {
              uVar35 = 0;
              do {
                ppdVar2[uVar35][uVar35] = ppdVar2[uVar35][uVar35] - dVar38;
                uVar35 = uVar35 + 1;
              } while (uVar31 + 1 != uVar35);
            }
            local_c0 = local_c0 + dVar38;
            dVar40 = ABS(ppdVar2[uVar24][uVar31 - 2]) + ABS(pdVar14[uVar24]);
            dVar38 = dVar40 * 0.75;
            local_b8 = dVar40 * -0.4375 * dVar40;
            local_78 = dVar38;
          }
          if (iVar27 == 0x1e) {
            dVar37 = (local_78 - dVar38) * 0.5;
            dVar40 = dVar37 * dVar37 + local_b8;
            if (0.0 < dVar40) {
              if (dVar40 < 0.0) {
                auVar57._8_4_ = SUB84(dStack_40,0);
                auVar57._0_8_ = dVar43;
                auVar57._12_4_ = (int)((ulong)dStack_40 >> 0x20);
                dVar40 = sqrt(dVar40);
                dStack_40 = auVar57._8_8_;
              }
              else {
                dVar40 = SQRT(dVar40);
              }
              dVar40 = dVar38 - local_b8 /
                                (dVar37 + (double)(~-(ulong)(local_78 < dVar38) & (ulong)dVar40 |
                                                  (ulong)-dVar40 & -(ulong)(local_78 < dVar38)));
              if (-1 < (int)uVar31) {
                ppdVar2 = (this->H).data_;
                uVar35 = 0;
                do {
                  pdVar14 = ppdVar2[uVar35];
                  pdVar14[uVar35] = pdVar14[uVar35] - dVar40;
                  uVar35 = uVar35 + 1;
                } while (uVar31 + 1 != uVar35);
              }
              local_c0 = local_c0 + dVar40;
              local_b8 = 0.964;
              dVar38 = 0.964;
              local_78 = 0.964;
            }
          }
          uVar25 = uVar31 - 2;
          uVar35 = (ulong)uVar25;
          if ((int)uVar22 <= (int)uVar25) {
            ppdVar2 = (this->H).data_;
            pdVar14 = ppdVar2[uVar25];
            uVar20 = uVar24;
            dVar48 = pdVar14[uVar25];
            dVar37 = ppdVar2[uVar13][uVar24];
            do {
              dVar43 = dVar48;
              uVar35 = (ulong)(uVar20 - 1);
              dVar45 = ppdVar2[uVar20][uVar20];
              dVar55 = ppdVar2[uVar20][uVar35];
              local_a8._0_8_ =
                   ((dVar38 - dVar43) * (local_78 - dVar43) + -local_b8) / dVar55 + pdVar14[uVar20];
              auVar64._0_8_ = ((dVar45 - dVar43) - (dVar38 - dVar43)) - (local_78 - dVar43);
              auVar64._8_8_ = dVar37;
              dVar40 = ABS(dVar37) + ABS(auVar64._0_8_) + ABS((double)local_a8._0_8_);
              local_a8._0_8_ = (double)local_a8._0_8_ / dVar40;
              auVar8._8_4_ = SUB84(dVar40,0);
              auVar8._0_8_ = dVar40;
              auVar8._12_4_ = (int)((ulong)dVar40 >> 0x20);
              auVar57 = divpd(auVar64,auVar8);
              dStack_40 = auVar57._0_8_;
              dVar62 = auVar57._8_8_;
              if (uVar20 - uVar22 == 1) {
                uVar35 = (ulong)uVar22;
                break;
              }
              uVar25 = uVar20 - 2;
              pdVar28 = pdVar14 + uVar25;
              pdVar14 = ppdVar2[uVar25];
              uVar20 = uVar20 - 1;
              dVar48 = pdVar14[uVar25];
              dVar37 = dVar55;
            } while ((ABS(dVar43) + ABS(pdVar14[uVar25]) + ABS(dVar45)) *
                     ABS((double)local_a8._0_8_) * 2.220446049250313e-16 <=
                     (ABS(dVar62) + ABS(dStack_40)) * ABS(*pdVar28));
            local_a8._8_8_ = 0;
          }
          uVar25 = (uint)uVar35;
          if ((int)(uVar25 + 2) <= (int)uVar31) {
            ppdVar2 = (this->H).data_;
            uVar13 = uVar35;
            do {
              iVar12 = (int)uVar13;
              pdVar14 = ppdVar2[iVar12 + 2U];
              pdVar14[uVar13] = 0.0;
              if ((int)(uVar25 + 2) < (int)(iVar12 + 2U)) {
                pdVar14[iVar12 - 1] = 0.0;
              }
              uVar13 = (ulong)(iVar12 + 1U);
            } while (uVar31 - 1 != iVar12 + 1U);
          }
          iVar27 = iVar27 + 1;
          if ((int)uVar25 < (int)uVar31) {
            ppdVar2 = (this->V).data_;
            ppdVar19 = (this->H).data_;
            auVar36._8_8_ = dStack_40;
            auVar36._0_8_ = dVar62;
            auVar66._8_8_ = dVar40;
            auVar66._0_8_ = dVar40;
            uVar13 = uVar35;
            do {
              uVar20 = (uint)uVar13;
              if (uVar20 != uVar25) {
                uVar23 = uVar20 - 1;
                dVar62 = 0.0;
                if (uVar20 != uVar24) {
                  dVar62 = ppdVar19[uVar20 + 2][uVar23];
                }
                local_a8._0_8_ = ppdVar19[uVar13][uVar23];
                auVar36._8_8_ = ppdVar19[uVar20 + 1][uVar23];
                auVar36._0_8_ = dVar62;
                dVar38 = ABS(dVar62) +
                         ABS(ppdVar19[uVar20 + 1][uVar23]) + ABS((double)local_a8._0_8_);
                if ((dVar38 != 0.0) || (NAN(dVar38))) {
                  local_a8._8_8_ = 0;
                  local_a8._0_8_ = (double)local_a8._0_8_ / dVar38;
                  auVar39._8_8_ = dVar38;
                  auVar39._0_8_ = dVar38;
                  auVar36 = divpd(auVar36,auVar39);
                }
                else {
                  local_a8._8_8_ = 0;
                }
              }
              dVar62 = auVar36._0_8_;
              dVar37 = auVar36._8_8_;
              uVar60 = SUB84(dVar43,0);
              uVar61 = (undefined4)((ulong)dVar43 >> 0x20);
              uVar41 = auVar36._8_4_;
              uVar42 = auVar36._12_4_;
              if ((dVar38 == 0.0) && (!NAN(dVar38))) {
                dVar40 = auVar66._0_8_;
                break;
              }
              dVar43 = SQRT(dVar62 * dVar62 +
                            (double)local_a8._0_8_ * (double)local_a8._0_8_ + dVar37 * dVar37);
              dVar48 = -dVar43;
              auVar46._0_8_ = ~-(ulong)((double)local_a8._0_8_ < 0.0) & (ulong)dVar43;
              auVar46._8_8_ = 0;
              auVar65._0_8_ = -(ulong)((double)local_a8._0_8_ < 0.0) & (ulong)dVar48;
              auVar65._8_8_ = local_a8._8_8_ & 0x8000000000000000;
              auVar66 = auVar65 | auVar46;
              dVar40 = auVar66._0_8_;
              if ((dVar43 != dVar48) || (NAN(dVar43) || NAN(dVar48))) {
                if (uVar20 == uVar25) {
                  if (uVar22 != uVar25) {
                    ppdVar19[uVar35][uVar25 - 1] = -ppdVar19[uVar35][uVar25 - 1];
                  }
                }
                else {
                  ppdVar19[uVar13][uVar20 - 1] = dVar38 * -dVar40;
                }
                dVar43 = (double)local_a8._0_8_ + dVar40;
                dVar38 = dVar43 / dVar40;
                dVar48 = dVar37 / dVar40;
                auVar7._8_4_ = SUB84(dVar43,0);
                auVar7._0_8_ = dVar40;
                auVar7._12_4_ = (int)((ulong)dVar43 >> 0x20);
                auVar57 = divpd(auVar36,auVar7);
                dVar62 = dVar62 / dVar43;
                dVar37 = auVar57._8_8_;
                uVar41 = auVar57._8_4_;
                uVar42 = auVar57._12_4_;
                dVar43 = auVar57._0_8_;
                if ((int)uVar20 < (int)uVar15) {
                  pdVar14 = ppdVar19[uVar13];
                  pdVar28 = ppdVar19[uVar20 + 1];
                  uVar34 = uVar13;
                  do {
                    dVar45 = pdVar14[uVar34];
                    dVar55 = pdVar28[uVar34] * dVar37 + dVar45;
                    if (uVar20 != uVar24) {
                      dVar45 = ppdVar19[uVar20 + 2][uVar34];
                      dVar55 = dVar62 * dVar45 + dVar55;
                      ppdVar19[uVar20 + 2][uVar34] = dVar45 - dVar55 * dVar43;
                      dVar45 = pdVar14[uVar34];
                    }
                    pdVar14[uVar34] = -dVar55 * dVar38 + dVar45;
                    pdVar28[uVar34] = -dVar55 * dVar48 + pdVar28[uVar34];
                    uVar23 = (int)uVar34 + 1;
                    uVar34 = (ulong)uVar23;
                  } while ((int)uVar23 < (int)uVar15);
                }
                uVar23 = uVar20 + 3;
                if ((int)uVar31 <= (int)(uVar20 + 3)) {
                  uVar23 = uVar31;
                }
                if (-1 < (int)uVar23) {
                  uVar34 = 0xffffffffffffffff;
                  do {
                    pdVar14 = ppdVar19[uVar34 + 1];
                    dVar45 = pdVar14[uVar13];
                    dVar55 = pdVar14[uVar20 + 1];
                    dVar59 = dVar38 * dVar45 + dVar48 * dVar55;
                    if (uVar20 != uVar24) {
                      dVar59 = dVar59 + dVar43 * pdVar14[uVar20 + 2];
                      pdVar14[uVar20 + 2] = pdVar14[uVar20 + 2] - dVar59 * dVar62;
                    }
                    pdVar14[uVar13] = dVar45 - dVar59;
                    pdVar14[uVar20 + 1] = -dVar59 * dVar37 + dVar55;
                    uVar34 = uVar34 + 1;
                  } while (uVar34 < uVar23);
                }
                lVar16 = 0;
                do {
                  pdVar14 = ppdVar2[lVar16];
                  dVar45 = pdVar14[uVar13];
                  dVar55 = pdVar14[uVar20 + 1];
                  uVar60 = local_a8._12_4_;
                  dVar59 = dVar38 * dVar45 + dVar48 * dVar55;
                  if (uVar20 != uVar24) {
                    dVar59 = dVar59 + dVar43 * pdVar14[uVar20 + 2];
                    pdVar14[uVar20 + 2] = pdVar14[uVar20 + 2] - dVar59 * dVar62;
                  }
                  pdVar14[uVar13] = dVar45 - dVar59;
                  pdVar14[uVar20 + 1] = -dVar59 * dVar37 + dVar55;
                  lVar16 = lVar16 + 1;
                } while (lVar33 != lVar16);
                local_a8._8_4_ = local_a8._8_4_;
                local_a8._0_8_ = dVar59;
                local_a8._12_4_ = uVar60;
                uVar60 = auVar57._0_4_;
                uVar61 = auVar57._4_4_;
              }
              dVar43 = (double)CONCAT44(uVar61,uVar60);
              uVar13 = (ulong)(uVar20 + 1);
              auVar36._8_8_ = dVar37;
              auVar36._0_8_ = dVar62;
            } while (uVar20 + 1 != uVar31);
            dStack_40 = (double)CONCAT44(uVar42,uVar41);
            dVar43 = (double)CONCAT44(uVar61,uVar60);
          }
        }
      } while (-1 < (int)uVar31);
      if (dVar76 != 0.0 && 0 < (int)uVar15) {
        pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppdVar2 = (this->H).data_;
        uVar22 = uVar15 - 3;
        uVar24 = uVar15 - 2;
        uVar13 = (ulong)uVar29;
        uVar31 = uVar15;
        do {
          uVar35 = (ulong)uVar22;
          dVar38 = pdVar3[uVar13];
          dVar37 = pdVar4[uVar13];
          if ((dVar37 != 0.0) || (NAN(dVar37))) {
            if (dVar37 < 0.0) {
              pdVar14 = ppdVar2[uVar13];
              uVar34 = (ulong)((int)uVar13 - 1);
              pdVar28 = ppdVar2[uVar34];
              if (ABS(pdVar14[uVar34]) <= ABS(pdVar28[uVar13])) {
                dVar48 = -pdVar28[uVar13];
                dVar45 = pdVar28[uVar34] - dVar38;
                if (ABS(dVar45) <= ABS(dVar37)) {
                  dVar55 = dVar45 / dVar37;
                  auVar47._0_8_ = dVar45 * dVar55 + dVar37;
                  auVar52._0_8_ = dVar55 * 0.0 + dVar48;
                  auVar52._8_8_ = dVar55 * dVar48;
                  auVar47._8_8_ = auVar47._0_8_;
                  auVar57 = divpd(auVar52,auVar47);
                }
                else {
                  dVar55 = dVar37 / dVar45;
                  auVar51._0_8_ = dVar55 * dVar37 + dVar45;
                  auVar44._0_8_ = dVar48 * dVar55 + 0.0;
                  auVar44._8_8_ = -dVar55 * 0.0 + dVar48;
                  auVar51._8_8_ = auVar51._0_8_;
                  auVar57 = divpd(auVar44,auVar51);
                }
                this->cdivr = (double)auVar57._0_8_;
                this->cdivi = (double)auVar57._8_8_;
                pdVar28[uVar34] = auVar57._0_8_;
                dVar48 = this->cdivi;
              }
              else {
                pdVar28[uVar34] = dVar37 / pdVar14[uVar34];
                dVar48 = -(pdVar14[uVar13] - dVar38) / pdVar14[uVar34];
              }
              pdVar28[uVar13] = dVar48;
              pdVar14[uVar34] = 0.0;
              pdVar14[uVar13] = 1.0;
              if (1 < uVar13) {
                lVar16 = uVar35 << 0x20;
                ppdVar19 = ppdVar2 + uVar35;
                dVar48 = -dVar37;
                dVar45 = ABS(dVar37);
                auVar6._8_4_ = SUB84(dVar37,0);
                auVar6._0_8_ = dVar37;
                auVar6._12_4_ = (int)((ulong)dVar48 >> 0x20);
                uVar21 = uVar34;
                do {
                  pdVar14 = ppdVar2[uVar35];
                  dVar55 = 0.0;
                  dVar59 = 0.0;
                  uVar17 = uVar21;
                  if ((long)(int)uVar21 <= (long)uVar13) {
                    do {
                      dVar55 = dVar55 + ppdVar2[uVar17][uVar13] * pdVar14[uVar17];
                      dVar59 = dVar59 + ppdVar2[uVar17][uVar34] * pdVar14[uVar17];
                      uVar25 = (int)uVar17 + 1;
                      uVar17 = (ulong)uVar25;
                    } while (uVar31 != uVar25);
                  }
                  dVar49 = pdVar14[uVar35] - dVar38;
                  dVar63 = pdVar4[uVar35];
                  iVar27 = (int)uVar35;
                  if (0.0 <= dVar63) {
                    if ((dVar63 != 0.0) || (NAN(dVar63))) {
                      dVar50 = pdVar14[uVar35 + 1];
                      pdVar28 = ppdVar2[uVar35 + 1];
                      dVar1 = pdVar28[uVar35];
                      dVar73 = pdVar3[uVar35] - dVar38;
                      dVar74 = dVar48 * dVar37 + dVar73 * dVar73 + dVar63 * dVar63;
                      dVar63 = (dVar73 + dVar73) * dVar37;
                      if ((dVar74 == 0.0) && (((!NAN(dVar74) && (dVar63 == 0.0)) && (!NAN(dVar63))))
                         ) {
                        dVar74 = (ABS(dVar43) + ABS(dVar1) + ABS(dVar50) + ABS(dVar49) + dVar45) *
                                 dVar76 * 2.220446049250313e-16;
                      }
                      dStack_40 = auVar6._8_8_;
                      dVar73 = dVar37 * dVar55 + dVar50 * dVar62 + -dVar43 * dVar59;
                      dVar72 = dStack_40 * dVar59 + dVar50 * dVar40 + -dVar43 * dVar55;
                      if (ABS(dVar74) <= ABS(dVar63)) {
                        dVar75 = dVar74 / dVar63;
                        dVar63 = dVar74 * dVar75 + dVar63;
                        auVar69._0_8_ = dVar72 * dVar75 + -dVar73;
                        auVar69._8_8_ = dVar73 * dVar75 + dVar72;
                        auVar11._8_8_ = dVar63;
                        auVar11._0_8_ = dVar63;
                        auVar57 = divpd(auVar69,auVar11);
                      }
                      else {
                        dVar75 = dVar63 / dVar74;
                        dVar74 = dVar63 * dVar75 + dVar74;
                        auVar67._0_8_ = dVar72 + -dVar75 * dVar73;
                        auVar67._8_8_ = dVar73 + dVar75 * dVar72;
                        auVar10._8_8_ = dVar74;
                        auVar10._0_8_ = dVar74;
                        auVar57 = divpd(auVar67,auVar10);
                      }
                      dVar73 = auVar57._8_8_;
                      this->cdivr = dVar73;
                      this->cdivi = auVar57._0_8_;
                      pdVar14[uVar34] = dVar73;
                      dVar63 = this->cdivi;
                      pdVar14[uVar13] = dVar63;
                      if (ABS(dVar50) <= dVar45 + ABS(dVar43)) {
                        dVar55 = dVar73 * -dVar1 - dVar62;
                        dVar59 = dVar63 * -dVar1 - dVar40;
                        if (ABS(dVar43) <= dVar45) {
                          dVar63 = dVar43 / dVar37;
                          auVar58._0_8_ = dVar63 * dVar43 + dVar37;
                          auVar58._8_8_ = auVar58._0_8_;
                          auVar71._0_8_ = dVar59 * dVar63 + -dVar55;
                          auVar71._8_8_ = dVar55 * dVar63 + dVar59;
                          auVar57 = divpd(auVar71,auVar58);
                        }
                        else {
                          dVar63 = dVar37 / dVar43;
                          auVar54._0_8_ = dVar63 * dVar37 + dVar43;
                          auVar70._0_8_ = dVar59 + -dVar63 * dVar55;
                          auVar70._8_8_ = dVar55 + dVar63 * dVar59;
                          auVar54._8_8_ = auVar54._0_8_;
                          auVar57 = divpd(auVar70,auVar54);
                        }
                        this->cdivr = auVar57._8_8_;
                        this->cdivi = auVar57._0_8_;
                        pdVar28[uVar34] = auVar57._8_8_;
                        dVar50 = this->cdivi;
                      }
                      else {
                        pdVar28[uVar34] = (dVar63 * dVar37 + (-dVar49 * dVar73 - dVar59)) / dVar50;
                        dVar50 = (pdVar14[uVar34] * dVar48 + (pdVar14[uVar13] * -dVar49 - dVar55)) /
                                 dVar50;
                      }
                    }
                    else {
                      dVar55 = -dVar55;
                      if (ABS(dVar49) <= dVar45) {
                        dVar63 = dVar49 / dVar37;
                        auVar53._0_8_ = dVar49 * dVar63 + dVar37;
                        auVar68._0_8_ = dVar63 * dVar55 + dVar59;
                        auVar68._8_8_ = dVar63 * -dVar59 + dVar55;
                        auVar53._8_8_ = auVar53._0_8_;
                        auVar57 = divpd(auVar68,auVar53);
                      }
                      else {
                        dVar63 = dVar37 / dVar49;
                        dVar49 = dVar63 * dVar37 + dVar49;
                        auVar56._0_8_ = dVar59 * dVar63 + dVar55;
                        auVar56._8_8_ = dVar55 * dVar63 + -dVar59;
                        auVar9._8_8_ = dVar49;
                        auVar9._0_8_ = dVar49;
                        auVar57 = divpd(auVar56,auVar9);
                      }
                      this->cdivr = auVar57._8_8_;
                      this->cdivi = auVar57._0_8_;
                      pdVar14[uVar34] = auVar57._8_8_;
                      dVar50 = this->cdivi;
                      pdVar28 = pdVar14;
                    }
                    pdVar28[uVar13] = dVar50;
                    dVar55 = ABS(pdVar14[uVar13]);
                    if (ABS(pdVar14[uVar13]) <= ABS(pdVar14[uVar34])) {
                      dVar55 = ABS(pdVar14[uVar34]);
                    }
                    if ((1.0 < dVar55 * 2.220446049250313e-16 * dVar55) &&
                       (ppdVar18 = ppdVar19, lVar26 = lVar16, (long)iVar27 <= (long)uVar13)) {
                      do {
                        pdVar14 = *ppdVar18;
                        pdVar14[uVar34] = pdVar14[uVar34] / dVar55;
                        pdVar14[uVar13] = pdVar14[uVar13] / dVar55;
                        lVar30 = lVar26 >> 0x20;
                        ppdVar18 = ppdVar18 + 1;
                        lVar26 = lVar26 + 0x100000000;
                      } while (lVar30 < (long)uVar13);
                    }
                    uVar21 = uVar35 & 0xffffffff;
                    dVar49 = dVar43;
                    dVar59 = dVar62;
                    dVar55 = dVar40;
                  }
                  dVar40 = dVar55;
                  dVar62 = dVar59;
                  dVar43 = dVar49;
                  uVar35 = uVar35 - 1;
                  lVar16 = lVar16 + -0x100000000;
                  ppdVar19 = ppdVar19 + -1;
                } while (0 < iVar27);
              }
            }
          }
          else {
            ppdVar2[uVar13][uVar13] = 1.0;
            if (uVar13 == 0) break;
            uVar34 = uVar13 & 0xffffffff;
            uVar35 = uVar13;
            uVar25 = uVar24;
            dVar37 = dVar43;
            do {
              uVar17 = uVar35 - 1;
              uVar32 = uVar17 & 0xffffffff;
              pdVar14 = ppdVar2[uVar32];
              dVar43 = 0.0;
              dVar62 = 0.0;
              uVar21 = uVar34;
              if ((long)(int)uVar34 <= (long)uVar13) {
                do {
                  dVar62 = dVar43 + pdVar14[uVar21] * ppdVar2[uVar21][uVar13];
                  uVar20 = (int)uVar21 + 1;
                  uVar21 = (ulong)uVar20;
                  dVar43 = dVar62;
                } while (uVar31 != uVar20);
              }
              dVar43 = pdVar14[uVar32] - dVar38;
              dVar48 = pdVar4[uVar32];
              dVar45 = dVar62;
              if (0.0 <= dVar48) {
                if ((dVar48 != 0.0) || (NAN(dVar48))) {
                  dVar45 = pdVar14[uVar35];
                  pdVar28 = ppdVar2[uVar35];
                  dVar55 = pdVar28[uVar32];
                  dVar48 = (dVar45 * dVar40 - dVar62 * dVar37) /
                           ((pdVar3[uVar32] - dVar38) * (pdVar3[uVar32] - dVar38) + dVar48 * dVar48)
                  ;
                  pdVar14[uVar13] = dVar48;
                  if (ABS(dVar45) <= ABS(dVar37)) {
                    pdVar28[uVar13] = (-dVar55 * dVar48 - dVar40) / dVar37;
                  }
                  else {
                    pdVar28[uVar13] = (-dVar43 * dVar48 - dVar62) / dVar45;
                  }
                }
                else {
                  if ((dVar43 == 0.0) && (!NAN(dVar43))) {
                    dVar43 = dVar76 * 2.220446049250313e-16;
                  }
                  pdVar14[uVar13] = -dVar62 / dVar43;
                }
                dVar43 = ABS(pdVar14[uVar13]);
                if ((1.0 < dVar43 * 2.220446049250313e-16 * dVar43) &&
                   ((long)(int)uVar17 <= (long)uVar13)) {
                  ppdVar19 = ppdVar2 + uVar25;
                  lVar16 = (ulong)uVar25 << 0x20;
                  do {
                    (*ppdVar19)[uVar13] = (*ppdVar19)[uVar13] / dVar43;
                    lVar26 = lVar16 >> 0x20;
                    lVar16 = lVar16 + 0x100000000;
                    ppdVar19 = ppdVar19 + 1;
                  } while (lVar26 < (long)uVar13);
                }
                uVar34 = uVar17 & 0xffffffff;
                dVar45 = dVar40;
                dVar43 = dVar37;
              }
              dVar40 = dVar45;
              uVar25 = uVar25 - 1;
              iVar27 = (int)uVar35;
              uVar35 = uVar17;
              dVar37 = dVar43;
            } while (1 < iVar27);
          }
          uVar31 = uVar31 - 1;
          uVar22 = uVar22 - 1;
          uVar24 = uVar24 - 1;
          bVar5 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar5);
        if (0 < (int)uVar15) {
          ppdVar2 = (this->V).data_;
          uVar13 = (ulong)uVar29;
          do {
            uVar15 = (uint)uVar13;
            if ((int)uVar29 < (int)(uint)uVar13) {
              uVar15 = uVar29;
            }
            ppdVar19 = (this->V).data_;
            ppdVar18 = (this->H).data_;
            lVar16 = 0;
            do {
              if ((int)uVar15 < 0) {
                dVar76 = 0.0;
              }
              else {
                dVar76 = 0.0;
                lVar26 = -1;
                do {
                  dVar76 = dVar76 + ppdVar19[lVar16][lVar26 + 1] * ppdVar18[lVar26 + 1][uVar13];
                  lVar26 = lVar26 + 1;
                } while (lVar26 < (int)uVar15);
              }
              ppdVar2[lVar16][uVar13] = dVar76;
              lVar16 = lVar16 + 1;
            } while (lVar16 != lVar33);
            bVar5 = 0 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void hqr2() {
      //  This is derived from the Algol procedure hqr2,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      // Initialize

      int nn       = this->n;
      int n        = nn - 1;
      int low      = 0;
      int high     = nn - 1;
      Real eps     = pow(2.0, -52.0);
      Real exshift = 0.0;
      Real p = 0, q = 0, r = 0, s = 0, z = 0, t, w, x, y;

      // Store roots isolated by balanc and compute matrix norm

      Real norm = 0.0;
      for (int i = 0; i < nn; i++) {
        if ((i < low) || (i > high)) {
          d(i) = H(i, i);
          e(i) = 0.0;
        }
        for (int j = max(i - 1, 0); j < nn; j++) {
          norm = norm + abs(H(i, j));
        }
      }

      // Outer loop over eigenvalue index

      int iter = 0;
      while (n >= low) {
        // Look for single small sub-diagonal element

        int l = n;
        while (l > low) {
          s = abs(H(l - 1, l - 1)) + abs(H(l, l));
          if (s == 0.0) { s = norm; }
          if (abs(H(l, l - 1)) < eps * s) { break; }
          l--;
        }

        // Check for convergence
        // One root found

        if (l == n) {
          H(n, n) = H(n, n) + exshift;
          d(n)    = H(n, n);
          e(n)    = 0.0;
          n--;
          iter = 0;

          // Two roots found

        } else if (l == n - 1) {
          w               = H(n, n - 1) * H(n - 1, n);
          p               = (H(n - 1, n - 1) - H(n, n)) / 2.0;
          q               = p * p + w;
          z               = sqrt(abs(q));
          H(n, n)         = H(n, n) + exshift;
          H(n - 1, n - 1) = H(n - 1, n - 1) + exshift;
          x               = H(n, n);

          // Real pair

          if (q >= 0) {
            if (p >= 0) {
              z = p + z;
            } else {
              z = p - z;
            }
            d(n - 1) = x + z;
            d(n)     = d(n - 1);
            if (z != 0.0) { d(n) = x - w / z; }
            e(n - 1) = 0.0;
            e(n)     = 0.0;
            x        = H(n, n - 1);
            s        = abs(x) + abs(z);
            p        = x / s;
            q        = z / s;
            r        = sqrt(p * p + q * q);
            p        = p / r;
            q        = q / r;

            // Row modification

            for (int j = n - 1; j < nn; j++) {
              z           = H(n - 1, j);
              H(n - 1, j) = q * z + p * H(n, j);
              H(n, j)     = q * H(n, j) - p * z;
            }

            // Column modification

            for (int i = 0; i <= n; i++) {
              z           = H(i, n - 1);
              H(i, n - 1) = q * z + p * H(i, n);
              H(i, n)     = q * H(i, n) - p * z;
            }

            // Accumulate transformations

            for (int i = low; i <= high; i++) {
              z           = V(i, n - 1);
              V(i, n - 1) = q * z + p * V(i, n);
              V(i, n)     = q * V(i, n) - p * z;
            }

            // Complex pair

          } else {
            d(n - 1) = x + p;
            d(n)     = x + p;
            e(n - 1) = z;
            e(n)     = -z;
          }
          n    = n - 2;
          iter = 0;

          // No convergence yet

        } else {
          // Form shift

          x = H(n, n);
          y = 0.0;
          w = 0.0;
          if (l < n) {
            y = H(n - 1, n - 1);
            w = H(n, n - 1) * H(n - 1, n);
          }

          // Wilkinson's original ad hoc shift

          if (iter == 10) {
            exshift += x;
            for (int i = low; i <= n; i++) {
              H(i, i) -= x;
            }
            s = abs(H(n, n - 1)) + abs(H(n - 1, n - 2));
            x = y = 0.75 * s;
            w     = -0.4375 * s * s;
          }

          // MATLAB's new ad hoc shift

          if (iter == 30) {
            s = (y - x) / 2.0;
            s = s * s + w;
            if (s > 0) {
              s = sqrt(s);
              if (y < x) { s = -s; }
              s = x - w / ((y - x) / 2.0 + s);
              for (int i = low; i <= n; i++) {
                H(i, i) -= s;
              }
              exshift += s;
              x = y = w = 0.964;
            }
          }

          iter = iter + 1;  // (Could check iteration count here.)

          // Look for two consecutive small sub-diagonal elements

          int m = n - 2;
          while (m >= l) {
            z = H(m, m);
            r = x - z;
            s = y - z;
            p = (r * s - w) / H(m + 1, m) + H(m, m + 1);
            q = H(m + 1, m + 1) - z - r - s;
            r = H(m + 2, m + 1);
            s = abs(p) + abs(q) + abs(r);
            p = p / s;
            q = q / s;
            r = r / s;
            if (m == l) { break; }
            if (abs(H(m, m - 1)) * (abs(q) + abs(r)) <
                eps * (abs(p) * (abs(H(m - 1, m - 1)) + abs(z) +
                                 abs(H(m + 1, m + 1))))) {
              break;
            }
            m--;
          }

          for (int i = m + 2; i <= n; i++) {
            H(i, i - 2) = 0.0;
            if (i > m + 2) { H(i, i - 3) = 0.0; }
          }

          // Double QR step involving rows l:n and columns m:n

          for (int k = m; k <= n - 1; k++) {
            int notlast = (k != n - 1);
            if (k != m) {
              p = H(k, k - 1);
              q = H(k + 1, k - 1);
              r = (notlast ? H(k + 2, k - 1) : 0.0);
              x = abs(p) + abs(q) + abs(r);
              if (x != 0.0) {
                p = p / x;
                q = q / x;
                r = r / x;
              }
            }
            if (x == 0.0) { break; }
            s = sqrt(p * p + q * q + r * r);
            if (p < 0) { s = -s; }
            if (s != 0) {
              if (k != m) {
                H(k, k - 1) = -s * x;
              } else if (l != m) {
                H(k, k - 1) = -H(k, k - 1);
              }
              p = p + s;
              x = p / s;
              y = q / s;
              z = r / s;
              q = q / p;
              r = r / p;

              // Row modification

              for (int j = k; j < nn; j++) {
                p = H(k, j) + q * H(k + 1, j);
                if (notlast) {
                  p           = p + r * H(k + 2, j);
                  H(k + 2, j) = H(k + 2, j) - p * z;
                }
                H(k, j)     = H(k, j) - p * x;
                H(k + 1, j) = H(k + 1, j) - p * y;
              }

              // Column modification

              for (int i = 0; i <= min(n, k + 3); i++) {
                p = x * H(i, k) + y * H(i, k + 1);
                if (notlast) {
                  p           = p + z * H(i, k + 2);
                  H(i, k + 2) = H(i, k + 2) - p * r;
                }
                H(i, k)     = H(i, k) - p;
                H(i, k + 1) = H(i, k + 1) - p * q;
              }

              // Accumulate transformations

              for (int i = low; i <= high; i++) {
                p = x * V(i, k) + y * V(i, k + 1);
                if (notlast) {
                  p           = p + z * V(i, k + 2);
                  V(i, k + 2) = V(i, k + 2) - p * r;
                }
                V(i, k)     = V(i, k) - p;
                V(i, k + 1) = V(i, k + 1) - p * q;
              }
            }  // (s != 0)
          }    // k loop
        }      // check convergence
      }        // while (n >= low)

      // Backsubstitute to find vectors of upper triangular form

      if (norm == 0.0) { return; }

      for (n = nn - 1; n >= 0; n--) {
        p = d(n);
        q = e(n);

        // Real vector

        if (q == 0) {
          int l   = n;
          H(n, n) = 1.0;
          for (int i = n - 1; i >= 0; i--) {
            w = H(i, i) - p;
            r = 0.0;
            for (int j = l; j <= n; j++) {
              r = r + H(i, j) * H(j, n);
            }
            if (e(i) < 0.0) {
              z = w;
              s = r;
            } else {
              l = i;
              if (e(i) == 0.0) {
                if (w != 0.0) {
                  H(i, n) = -r / w;
                } else {
                  H(i, n) = -r / (eps * norm);
                }

                // Solve real equations

              } else {
                x       = H(i, i + 1);
                y       = H(i + 1, i);
                q       = (d(i) - p) * (d(i) - p) + e(i) * e(i);
                t       = (x * s - z * r) / q;
                H(i, n) = t;
                if (abs(x) > abs(z)) {
                  H(i + 1, n) = (-r - w * t) / x;
                } else {
                  H(i + 1, n) = (-s - y * t) / z;
                }
              }

              // Overflow control

              t = abs(H(i, n));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n) = H(j, n) / t;
                }
              }
            }
          }

          // Complex vector

        } else if (q < 0) {
          int l = n - 1;

          // Last vector component imaginary so matrix is triangular

          if (abs(H(n, n - 1)) > abs(H(n - 1, n))) {
            H(n - 1, n - 1) = q / H(n, n - 1);
            H(n - 1, n)     = -(H(n, n) - p) / H(n, n - 1);
          } else {
            cdiv(0.0, -H(n - 1, n), H(n - 1, n - 1) - p, q);
            H(n - 1, n - 1) = cdivr;
            H(n - 1, n)     = cdivi;
          }
          H(n, n - 1) = 0.0;
          H(n, n)     = 1.0;
          for (int i = n - 2; i >= 0; i--) {
            Real ra, sa, vr, vi;
            ra = 0.0;
            sa = 0.0;
            for (int j = l; j <= n; j++) {
              ra = ra + H(i, j) * H(j, n - 1);
              sa = sa + H(i, j) * H(j, n);
            }
            w = H(i, i) - p;

            if (e(i) < 0.0) {
              z = w;
              r = ra;
              s = sa;
            } else {
              l = i;
              if (e(i) == 0) {
                cdiv(-ra, -sa, w, q);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
              } else {
                // Solve complex equations

                x  = H(i, i + 1);
                y  = H(i + 1, i);
                vr = (d(i) - p) * (d(i) - p) + e(i) * e(i) - q * q;
                vi = (d(i) - p) * 2.0 * q;
                if ((vr == 0.0) && (vi == 0.0)) {
                  vr =
                      eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(z));
                }
                cdiv(x * r - z * ra + q * sa, x * s - z * sa - q * ra, vr, vi);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
                if (abs(x) > (abs(z) + abs(q))) {
                  H(i + 1, n - 1) = (-ra - w * H(i, n - 1) + q * H(i, n)) / x;
                  H(i + 1, n)     = (-sa - w * H(i, n) - q * H(i, n - 1)) / x;
                } else {
                  cdiv(-r - y * H(i, n - 1), -s - y * H(i, n), z, q);
                  H(i + 1, n - 1) = cdivr;
                  H(i + 1, n)     = cdivi;
                }
              }

              // Overflow control

              t = max(abs(H(i, n - 1)), abs(H(i, n)));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n - 1) = H(j, n - 1) / t;
                  H(j, n)     = H(j, n) / t;
                }
              }
            }
          }
        }
      }

      // Vectors of isolated roots

      for (int i = 0; i < nn; i++) {
        if (i < low || i > high) {
          for (int j = i; j < nn; j++) {
            V(i, j) = H(i, j);
          }
        }
      }

      // Back transformation to get eigenvectors of original matrix

      for (int j = nn - 1; j >= low; j--) {
        for (int i = low; i <= high; i++) {
          z = 0.0;
          for (int k = low; k <= min(j, high); k++) {
            z = z + V(i, k) * H(k, j);
          }
          V(i, j) = z;
        }
      }
    }